

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::AssignmentExpression::fromSyntax
          (Compilation *compilation,BinaryExpressionSyntax *syntax,ASTContext *context)

{
  SourceRange sourceRange;
  Expression *lhs_00;
  _Optional_payload_base<slang::ast::BinaryOperator> compilation_00;
  bitmask<slang::ast::AssignFlags> bVar1;
  bool bVar2;
  bool bVar3;
  bitmask<slang::ast::ASTFlags> *pbVar4;
  TimingControlSyntax *pTVar5;
  undefined4 extraout_var;
  ExpressionSyntax *pEVar6;
  SyntaxNode *this;
  Type *pTVar7;
  Expression *pEVar8;
  SourceLocation SVar9;
  socklen_t __len;
  optional<slang::ast::BinaryOperator> op_00;
  optional<slang::ast::BinaryOperator> op_01;
  SourceRange SVar10;
  ASTContext *in_stack_fffffffffffffd18;
  byte local_1f9;
  bool local_1d9;
  SourceLocation local_1d8;
  SourceLocation local_1d0;
  Expression *local_1a0;
  Expression *rhs;
  underlying_type local_190;
  Expression *local_188;
  Expression *lhs;
  SourceLocation local_178;
  SourceLocation local_170;
  uint local_164;
  _Optional_payload_base<slang::ast::BinaryOperator> local_160;
  bitmask<slang::ast::ASTFlags> local_158;
  Expression *local_150;
  Expression *lhs_1;
  Expression *local_140;
  Expression *rhs_1;
  AssignmentPatternExpressionSyntax *pattern;
  TimingControlExpressionSyntax *tce;
  bitmask<slang::ast::ASTFlags> local_120;
  undefined1 local_118 [8];
  ASTContext timingCtx;
  SourceLocation local_d8;
  TimingControl *timingControl;
  ExpressionSyntax *rightExpr;
  BinaryOperator local_bc;
  _Optional_payload_base<slang::ast::BinaryOperator> local_b8;
  _Optional_payload_base<slang::ast::BinaryOperator> local_b0;
  optional<slang::ast::BinaryOperator> op;
  bitmask<slang::ast::ASTFlags> extraFlags;
  bitmask<slang::ast::ASTFlags> local_70;
  bitmask<slang::ast::ASTFlags> local_68;
  bitmask<slang::ast::ASTFlags> local_60;
  SourceRange local_58;
  DiagCode local_44;
  bitmask<slang::ast::ASTFlags> local_40;
  bitmask<slang::ast::AssignFlags> local_34;
  byte local_2d;
  bitmask<slang::ast::AssignFlags> local_2c;
  bool isNonBlocking;
  SourceLocation SStack_28;
  bitmask<slang::ast::AssignFlags> assignFlags;
  ASTContext *context_local;
  BinaryExpressionSyntax *syntax_local;
  Compilation *compilation_local;
  
  SStack_28 = (SourceLocation)context;
  bitmask<slang::ast::AssignFlags>::bitmask(&local_2c);
  local_2d = (syntax->super_ExpressionSyntax).super_SyntaxNode.kind ==
             NonblockingAssignmentExpression;
  if ((bool)local_2d) {
    bitmask<slang::ast::AssignFlags>::bitmask(&local_34,NonBlocking);
    local_2c.m_bits = local_34.m_bits;
  }
  local_1d9 = false;
  if ((local_2d & 1) != 0) {
    pbVar4 = (bitmask<slang::ast::ASTFlags> *)((long)SStack_28 + 0x10);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_40,Final);
    local_1d9 = bitmask<slang::ast::ASTFlags>::has(pbVar4,&local_40);
  }
  SVar9 = SStack_28;
  if (local_1d9 == false) {
    pbVar4 = (bitmask<slang::ast::ASTFlags> *)((long)SStack_28 + 0x10);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_60,AssignmentAllowed);
    bVar2 = bitmask<slang::ast::ASTFlags>::has(pbVar4,&local_60);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&op,None);
      std::optional<slang::ast::BinaryOperator>::optional
                ((optional<slang::ast::BinaryOperator> *)&local_b0);
      if (((syntax->super_ExpressionSyntax).super_SyntaxNode.kind == AssignmentExpression) ||
         ((syntax->super_ExpressionSyntax).super_SyntaxNode.kind == NonblockingAssignmentExpression)
         ) {
        bitmask<slang::ast::ASTFlags>::bitmask
                  ((bitmask<slang::ast::ASTFlags> *)&rightExpr,StreamingAllowed);
        bitmask<slang::ast::ASTFlags>::operator|=
                  ((bitmask<slang::ast::ASTFlags> *)&op,(bitmask<slang::ast::ASTFlags> *)&rightExpr)
        ;
      }
      else {
        local_bc = Expression::getBinaryOperator
                             ((syntax->super_ExpressionSyntax).super_SyntaxNode.kind);
        std::optional<slang::ast::BinaryOperator>::optional<slang::ast::BinaryOperator,_true>
                  ((optional<slang::ast::BinaryOperator> *)&local_b8,&local_bc);
        local_b0 = local_b8;
      }
      timingControl =
           (TimingControl *)not_null::operator_cast_to_ExpressionSyntax_((not_null *)&syntax->right)
      ;
      local_d8 = (SourceLocation)0x0;
      pbVar4 = (bitmask<slang::ast::ASTFlags> *)((long)SStack_28 + 0x10);
      bitmask<slang::ast::ASTFlags>::bitmask
                ((bitmask<slang::ast::ASTFlags> *)&timingCtx.assertionInstance,TopLevelStatement);
      bVar3 = bitmask<slang::ast::ASTFlags>::has
                        (pbVar4,(bitmask<slang::ast::ASTFlags> *)&timingCtx.assertionInstance);
      bVar2 = false;
      if (bVar3) {
        bVar2 = *(SyntaxKind *)&timingControl->syntax == TimingControlExpression;
      }
      if (bVar2) {
        memcpy(local_118,(void *)SStack_28,0x38);
        bitmask<slang::ast::ASTFlags>::bitmask(&local_120,LValue);
        bitmask<slang::ast::ASTFlags>::operator|=
                  ((bitmask<slang::ast::ASTFlags> *)&timingCtx.lookupIndex,&local_120);
        if ((local_2d & 1) != 0) {
          bitmask<slang::ast::ASTFlags>::bitmask
                    ((bitmask<slang::ast::ASTFlags> *)&tce,NonBlockingTimingControl);
          bitmask<slang::ast::ASTFlags>::operator|=
                    ((bitmask<slang::ast::ASTFlags> *)&timingCtx.lookupIndex,
                     (bitmask<slang::ast::ASTFlags> *)&tce);
        }
        pattern = (AssignmentPatternExpressionSyntax *)
                  slang::syntax::SyntaxNode::as<slang::syntax::TimingControlExpressionSyntax>
                            ((SyntaxNode *)timingControl);
        pTVar5 = not_null<slang::syntax::TimingControlSyntax_*>::operator*
                           (&((TimingControlExpressionSyntax *)pattern)->timing);
        local_d8._0_4_ = TimingControl::bind((int)pTVar5,(sockaddr *)local_118,__len);
        local_d8._4_4_ = extraout_var;
        timingControl =
             (TimingControl *)
             not_null::operator_cast_to_ExpressionSyntax_((not_null *)&pattern->pattern);
      }
      pEVar6 = not_null<slang::syntax::ExpressionSyntax_*>::operator->(&syntax->left);
      if (((pEVar6->super_SyntaxNode).kind == AssignmentPatternExpression) &&
         (*(int *)&timingControl->syntax != 0x1a6)) {
        this = &not_null<slang::syntax::ExpressionSyntax_*>::operator->(&syntax->left)->
                super_SyntaxNode;
        rhs_1 = (Expression *)
                slang::syntax::SyntaxNode::as<slang::syntax::AssignmentPatternExpressionSyntax>
                          (this);
        SVar9 = SStack_28;
        if (rhs_1->constant == (ConstantValue *)0x0) {
          bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&lhs_1,None);
          local_140 = Expression::selfDetermined
                                (compilation,(ExpressionSyntax *)timingControl,(ASTContext *)SVar9,
                                 (bitmask<slang::ast::ASTFlags>)lhs_1);
          bVar2 = Expression::bad(local_140);
          if (!bVar2) {
            pEVar6 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->left);
            SVar9 = SStack_28;
            bitmask<slang::ast::ASTFlags>::bitmask(&local_158,LValue);
            pTVar7 = not_null::operator_cast_to_Type_((not_null *)&local_140->type);
            local_150 = Expression::create(compilation,pEVar6,(ASTContext *)SVar9,local_158,pTVar7);
            Expression::selfDetermined((ASTContext *)SStack_28,&local_150);
            lhs_00 = local_140;
            pEVar8 = local_150;
            local_160 = local_b0;
            local_164 = local_2c.m_bits;
            local_170 = parsing::Token::location(&syntax->operatorToken);
            _lhs = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
            op_00.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::BinaryOperator>._4_4_ = 0;
            op_00.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::BinaryOperator>._M_payload =
                 (_Storage<slang::ast::BinaryOperator,_true>)local_164;
            SVar10.endLoc = SStack_28;
            SVar10.startLoc = local_178;
            pEVar8 = fromComponents((AssignmentExpression *)compilation,(Compilation *)local_160,
                                    op_00,(bitmask<slang::ast::AssignFlags>)(underlying_type)pEVar8,
                                    lhs_00,(Expression *)local_170,local_d8,(TimingControl *)lhs,
                                    SVar10,in_stack_fffffffffffffd18);
            return pEVar8;
          }
          pEVar8 = Expression::badExpr(compilation,local_140);
          return pEVar8;
        }
      }
      pEVar6 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->left);
      SVar9 = SStack_28;
      bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&rhs,LValue);
      local_190 = (underlying_type)
                  bitmask<slang::ast::ASTFlags>::operator|
                            ((bitmask<slang::ast::ASTFlags> *)&op,
                             (bitmask<slang::ast::ASTFlags> *)&rhs);
      local_188 = Expression::selfDetermined
                            (compilation,pEVar6,(ASTContext *)SVar9,
                             (bitmask<slang::ast::ASTFlags>)local_190);
      local_1a0 = (Expression *)0x0;
      pTVar7 = not_null<const_slang::ast::Type_*>::operator->(&local_188->type);
      bVar2 = Type::isVirtualInterface(pTVar7);
      SVar9 = SStack_28;
      if (bVar2) {
        pTVar7 = not_null<const_slang::ast::Type_*>::operator*(&local_188->type);
        local_1a0 = Expression::tryBindInterfaceRef
                              ((ASTContext *)SVar9,(ExpressionSyntax *)timingControl,pTVar7);
      }
      SVar9 = SStack_28;
      if (local_1a0 == (Expression *)0x0) {
        if ((local_188->kind == Streaming) && (*(int *)&timingControl->syntax != 0x1a6)) {
          local_1a0 = Expression::selfDetermined
                                (compilation,(ExpressionSyntax *)timingControl,
                                 (ASTContext *)SStack_28,
                                 (bitmask<slang::ast::ASTFlags>)
                                 op.super__Optional_base<slang::ast::BinaryOperator,_true,_true>.
                                 _M_payload.super__Optional_payload_base<slang::ast::BinaryOperator>
                                );
        }
        else {
          pTVar7 = not_null::operator_cast_to_Type_((not_null *)&local_188->type);
          local_1a0 = Expression::create(compilation,(ExpressionSyntax *)timingControl,
                                         (ASTContext *)SVar9,
                                         (bitmask<slang::ast::ASTFlags>)
                                         op.
                                         super__Optional_base<slang::ast::BinaryOperator,_true,_true>
                                         ._M_payload.
                                         super__Optional_payload_base<slang::ast::BinaryOperator>,
                                         pTVar7);
        }
      }
      bVar1.m_bits = local_2c.m_bits;
      compilation_00 = local_b0;
      pEVar8 = local_188;
      SVar9 = parsing::Token::location(&syntax->operatorToken);
      SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      op_01.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ast::BinaryOperator>._4_4_ = 0;
      op_01.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ast::BinaryOperator>._M_payload =
           (_Storage<slang::ast::BinaryOperator,_true>)bVar1.m_bits;
      local_1d8 = SVar10.startLoc;
      local_1d0 = SVar10.endLoc;
      sourceRange.endLoc = SStack_28;
      sourceRange.startLoc = local_1d0;
      compilation_local =
           (Compilation *)
           fromComponents((AssignmentExpression *)compilation,(Compilation *)compilation_00,op_01,
                          (bitmask<slang::ast::AssignFlags>)(underlying_type)pEVar8,local_1a0,
                          (Expression *)SVar9,local_d8,(TimingControl *)local_1d8,sourceRange,
                          in_stack_fffffffffffffd18);
    }
    else {
      pbVar4 = (bitmask<slang::ast::ASTFlags> *)((long)SStack_28 + 0x10);
      bitmask<slang::ast::ASTFlags>::bitmask(&local_68,NonProcedural);
      bVar2 = bitmask<slang::ast::ASTFlags>::has(pbVar4,&local_68);
      local_1f9 = 0;
      if (!bVar2) {
        pbVar4 = (bitmask<slang::ast::ASTFlags> *)((long)SStack_28 + 0x10);
        bitmask<slang::ast::ASTFlags>::bitmask(&local_70,AssignmentDisallowed);
        bVar2 = bitmask<slang::ast::ASTFlags>::has(pbVar4,&local_70);
        local_1f9 = bVar2 ^ 0xff;
      }
      SVar9 = SStack_28;
      if ((local_1f9 & 1) == 0) {
        SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        ASTContext::addDiag((ASTContext *)SVar9,(DiagCode)0xb0007,SVar10);
      }
      else {
        SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        ASTContext::addDiag((ASTContext *)SVar9,(DiagCode)0x160007,SVar10);
      }
      compilation_local = (Compilation *)Expression::badExpr(compilation,(Expression *)0x0);
    }
  }
  else {
    local_44.subsystem = Expressions;
    local_44.code = 0x9c;
    local_58 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    ASTContext::addDiag((ASTContext *)SVar9,local_44,local_58);
    compilation_local = (Compilation *)Expression::badExpr(compilation,(Expression *)0x0);
  }
  return (Expression *)compilation_local;
}

Assistant:

Expression& AssignmentExpression::fromSyntax(Compilation& compilation,
                                             const BinaryExpressionSyntax& syntax,
                                             const ASTContext& context) {
    bitmask<AssignFlags> assignFlags;
    bool isNonBlocking = syntax.kind == SyntaxKind::NonblockingAssignmentExpression;
    if (isNonBlocking)
        assignFlags = AssignFlags::NonBlocking;

    if (isNonBlocking && context.flags.has(ASTFlags::Final)) {
        context.addDiag(diag::NonblockingInFinal, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (!context.flags.has(ASTFlags::AssignmentAllowed)) {
        if (!context.flags.has(ASTFlags::NonProcedural) &&
            !context.flags.has(ASTFlags::AssignmentDisallowed)) {
            context.addDiag(diag::AssignmentRequiresParens, syntax.sourceRange());
        }
        else {
            context.addDiag(diag::AssignmentNotAllowed, syntax.sourceRange());
        }
        return badExpr(compilation, nullptr);
    }

    bitmask<ASTFlags> extraFlags = ASTFlags::None;
    std::optional<BinaryOperator> op;
    if (syntax.kind != SyntaxKind::AssignmentExpression &&
        syntax.kind != SyntaxKind::NonblockingAssignmentExpression) {
        op = getBinaryOperator(syntax.kind);
    }
    else {
        extraFlags |= ASTFlags::StreamingAllowed;
    }

    const ExpressionSyntax* rightExpr = syntax.right;

    // If we're in a top-level statement, check for an intra-assignment timing control.
    // Otherwise, we'll let this fall through to the default handler which will issue an error.
    const TimingControl* timingControl = nullptr;
    if (context.flags.has(ASTFlags::TopLevelStatement) &&
        rightExpr->kind == SyntaxKind::TimingControlExpression) {

        ASTContext timingCtx = context;
        timingCtx.flags |= ASTFlags::LValue;
        if (isNonBlocking)
            timingCtx.flags |= ASTFlags::NonBlockingTimingControl;

        auto& tce = rightExpr->as<TimingControlExpressionSyntax>();
        timingControl = &TimingControl::bind(*tce.timing, timingCtx);
        rightExpr = tce.expr;
    }

    // The right hand side of an assignment expression is typically an
    // "assignment-like context", except if the left hand side does not
    // have a self-determined type. That can only be true if the lhs is
    // an assignment pattern without an explicit type.
    // However, streaming concatenation has no explicit type either so it is excluded and such right
    // hand side will lead to diag::AssignmentPatternNoContext error later.
    if (syntax.left->kind == SyntaxKind::AssignmentPatternExpression &&
        rightExpr->kind != SyntaxKind::StreamingConcatenationExpression) {
        auto& pattern = syntax.left->as<AssignmentPatternExpressionSyntax>();
        if (!pattern.type) {
            // In this case we have to bind the rhs first to determine the
            // correct type to use as the context for the lhs.
            Expression* rhs = &selfDetermined(compilation, *rightExpr, context);
            if (rhs->bad())
                return badExpr(compilation, rhs);

            auto lhs = &create(compilation, *syntax.left, context, ASTFlags::LValue, rhs->type);
            selfDetermined(context, lhs);

            return fromComponents(compilation, op, assignFlags, *lhs, *rhs,
                                  syntax.operatorToken.location(), timingControl,
                                  syntax.sourceRange(), context);
        }
    }

    auto& lhs = selfDetermined(compilation, *syntax.left, context, extraFlags | ASTFlags::LValue);

    Expression* rhs = nullptr;
    if (lhs.type->isVirtualInterface())
        rhs = tryBindInterfaceRef(context, *rightExpr, *lhs.type);

    if (!rhs) {
        // When LHS is a streaming concatenation which has no explicit type, RHS should be
        // self-determined and we cannot pass lsh.type to it. When both LHS and RHS are streaming
        // concatenations, pass lhs.type to notify RHS to exclude associative arrays for
        // isBitstreamType check, while RHS can still be self-determined by ignoring lhs type
        // information.
        if (lhs.kind == ExpressionKind::Streaming &&
            rightExpr->kind != SyntaxKind::StreamingConcatenationExpression) {
            rhs = &selfDetermined(compilation, *rightExpr, context, extraFlags);
        }
        else {
            rhs = &create(compilation, *rightExpr, context, extraFlags, lhs.type);
        }
    }

    return fromComponents(compilation, op, assignFlags, lhs, *rhs, syntax.operatorToken.location(),
                          timingControl, syntax.sourceRange(), context);
}